

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_printf_html_escape(mg_connection *nc,char *fmt,...)

{
  char *__ptr;
  char in_AL;
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  int len;
  undefined8 in_RDX;
  char *buf_00;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  char mem [100];
  long lVar4;
  
  ap[0].reg_save_area = local_148;
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  buf = mem;
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  uVar1 = mg_avprintf(&buf,100,fmt,ap);
  __ptr = buf;
  if (-1 < (int)uVar1) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      len = (int)lVar3 - iVar2;
      lVar4 = lVar3;
      while( true ) {
        lVar3 = lVar4 + 1;
        if (lVar3 - (ulong)uVar1 == 1) {
          mg_send(nc,__ptr + iVar2,uVar1 - iVar2);
          goto LAB_0010cdfd;
        }
        if ((byte)(__ptr[lVar4] | 2U) == 0x3e) break;
        len = len + 1;
        lVar4 = lVar3;
      }
      mg_send(nc,__ptr + iVar2,len);
      buf_00 = "&gt;";
      if (__ptr[lVar4] == '<') {
        buf_00 = "&lt;";
      }
      mg_send(nc,buf_00,4);
      iVar2 = (int)lVar3;
    } while( true );
  }
LAB_0010cdfd:
  if (__ptr != (char *)0x0 && __ptr != mem) {
    free(__ptr);
  }
  return;
}

Assistant:

void mg_printf_html_escape(struct mg_connection *nc, const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int i, j, len;
    va_list ap;

    va_start(ap, fmt);
    len = mg_avprintf(&buf, sizeof(mem), fmt, ap);
    va_end(ap);

    if (len >= 0) {
        for (i = j = 0; i < len; i++) {
            if (buf[i] == '<' || buf[i] == '>') {
                mg_send(nc, buf + j, i - j);
                mg_send(nc, buf[i] == '<' ? "&lt;" : "&gt;", 4);
                j = i + 1;
            }
        }
        mg_send(nc, buf + j, i - j);
    }

    /* LCOV_EXCL_START */
    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
    /* LCOV_EXCL_STOP */
}